

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

int __thiscall DetectorSS::loghash(DetectorSS *this,unsigned_long p)

{
  int ret;
  unsigned_long p_local;
  DetectorSS *this_local;
  
  ret = 0;
  for (p_local = p; (p_local & 1) == 1; p_local = p_local >> 1) {
    ret = ret + 1;
  }
  return ret;
}

Assistant:

int DetectorSS::loghash(unsigned long p) {
	int ret = 0;
	while ((p & 0x00000001) == 1) {
		p >>= 1;
		ret++;
	}
	return ret;
}